

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client_test.cpp
# Opt level: O2

int main(void)

{
  HttpClient client;
  EventLoopGroup group;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  undefined1 local_210 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  size_type local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  __node_base_ptr *local_1c8;
  size_type local_1c0;
  __node_base local_1b8;
  size_type sStack_1b0;
  float local_1a8;
  size_t local_1a0;
  __node_base_ptr p_Stack_198;
  char *local_190;
  off_t oStack_188;
  off_t local_180;
  off_t oStack_178;
  HttpClient local_170;
  EventLoopGroup local_98;
  
  std::__cxx11::string::string((string *)&local_170,"EPOLL",(allocator *)local_210);
  Liby::EventLoopGroup::EventLoopGroup(&local_98,0,&local_170.host_);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::string
            ((string *)local_210,"www.dotamax.com",(allocator *)local_258._M_pod_data);
  Liby::http::HttpClient::HttpClient(&local_170,&local_98,(string *)local_210);
  std::__cxx11::string::~string((string *)local_210);
  local_210._8_8_ = &local_1f8;
  local_210._16_8_ = 0;
  local_1f8._M_local_buf[0] = '\0';
  local_1e8._M_p = (pointer)&local_1d8;
  local_1e0 = 0;
  local_1d8._M_local_buf[0] = '\0';
  local_1c8 = &p_Stack_198;
  local_1c0 = 1;
  local_1b8._M_nxt = (_Hash_node_base *)0x0;
  sStack_1b0 = 0;
  local_1a8 = 1.0;
  local_1a0 = 0;
  p_Stack_198 = (__node_base_ptr)0x0;
  local_190 = (char *)0x0;
  oStack_188 = 0;
  local_180 = 0;
  oStack_178 = 0;
  local_210._0_4_ = 1;
  std::__cxx11::string::assign(local_210 + 8);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<void_(Liby::http::Reply_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/http_client_test.cpp:13:20)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<void_(Liby::http::Reply_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/http_client_test.cpp:13:20)>
              ::_M_manager;
  Liby::http::HttpClient::get(&local_170,(Request *)local_210,(ReplyHandler *)&local_258);
  std::_Function_base::~_Function_base((_Function_base *)&local_258);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_220 = std::
              _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<bool_(),_Liby::EventLoopGroup::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/../src/EventLoopGroup.h:16:31)>
              ::_M_manager;
  Liby::EventLoopGroup::run(&local_98,(BoolFunctor *)&local_238);
  std::_Function_base::~_Function_base((_Function_base *)&local_238);
  Liby::http::Request::~Request((Request *)local_210);
  Liby::http::HttpClient::~HttpClient(&local_170);
  Liby::EventLoopGroup::~EventLoopGroup(&local_98);
  return 0;
}

Assistant:

int main(void) {
    EventLoopGroup group;
    HttpClient client(group, "www.dotamax.com");
    Request request;
    request.method_ = GET;
    request.uri_ = "/";
    auto handler = [](Reply &reply) {
        std::cout << reply.toString() << std::endl;
    };
    client.get(request, handler);
    group.run();
}